

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypesTestCase.cpp
# Opt level: O0

void __thiscall
SuiteFieldTypesTests::TestDateTime_nowLocal::~TestDateTime_nowLocal(TestDateTime_nowLocal *this)

{
  TestDateTime_nowLocal *this_local;
  
  ~TestDateTime_nowLocal(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(DateTime_nowLocal)
{
  time_t currTime;
  currTime = time(NULL);
  localtime(&currTime);

  FIX::DateTime localTime = FIX::DateTime::nowLocal();

  CHECK(localTime.m_date > 0);
  CHECK(localTime.m_time > 0);
}